

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Mapping.cpp
# Opt level: O2

int __thiscall axl::io::Mapping::open(Mapping *this,char *__file,int __oflag,...)

{
  SharedMemory *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  void *pvVar5;
  uint in_ECX;
  uint __oflag_00;
  EVP_PKEY_CTX *src;
  
  close(this,(int)__file);
  uVar2 = (in_ECX & 1) * 2 ^ 2;
  __oflag_00 = uVar2 + 0x40;
  if ((in_ECX & 4) != 0) {
    __oflag_00 = uVar2;
  }
  this_00 = &this->m_sharedMemory;
  iVar3 = psx::SharedMemory::open(this_00,__file,__oflag_00,0x1b6);
  if ((char)iVar3 != '\0') {
    if ((in_ECX & 4) == 0) {
      uVar4 = psx::File::getSize(&this_00->super_File);
      if (___oflag <= uVar4) goto LAB_00147587;
      bVar1 = psx::File::setSize(&this_00->super_File,___oflag);
      if (bVar1) goto LAB_00147587;
    }
    else {
LAB_00147587:
      pvVar5 = psx::Mapping::map(&this->m_mapping,(void *)0x0,___oflag,
                                 (uint)((in_ECX & 1) == 0) * 2 + 1,1,
                                 (this->m_sharedMemory).super_File.
                                 super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>
                                 .m_h,0);
      if (pvVar5 != (void *)0x0) {
        if ((in_ECX & 4) == 0) {
          sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                    (&this->m_sharedMemoryName,(EVP_PKEY_CTX *)__file,src);
        }
        this->m_p = pvVar5;
        this->m_size = ___oflag;
        goto LAB_001475e9;
      }
      if ((in_ECX & 4) != 0) goto LAB_001475e6;
    }
    psx::SharedMemory::unlink(__file);
  }
LAB_001475e6:
  pvVar5 = (void *)0x0;
LAB_001475e9:
  return (int)pvVar5;
}

Assistant:

void*
Mapping::open(
	const sl::StringRef& name,
	size_t size,
	uint_t flags
) {
	ASSERT(size != -1);

	close();

	void* p;

#if (_AXL_OS_WIN)
	uint_t protection = (flags & FileFlag_ReadOnly) ? PAGE_READONLY : PAGE_READWRITE;
	uint_t access = (flags & FileFlag_ReadOnly) ? FILE_MAP_READ : FILE_MAP_READ | FILE_MAP_WRITE;

	sl::String_w name_w = name;

	bool result = (flags & FileFlag_OpenExisting) ?
		m_mapping.open(access, false, name_w):
		m_mapping.create(INVALID_HANDLE_VALUE, NULL, protection, size, name_w);

	if (!result)
		return NULL;

	p = m_view.view(m_mapping, access, 0, size);
	if (!p) {
		m_mapping.close();
		return NULL;
	}
#elif (_AXL_OS_POSIX)
	int shmFlags = (flags & FileFlag_ReadOnly) ? O_RDONLY : O_RDWR;
	int protection = (flags & FileFlag_ReadOnly) ? PROT_READ : PROT_READ | PROT_WRITE;

	if (!(flags & FileFlag_OpenExisting))
		shmFlags |= O_CREAT;

	bool result = m_sharedMemory.open(name, shmFlags, S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP | S_IROTH | S_IWOTH);
	if (!result)
		return NULL;

	if (!(flags & FileFlag_OpenExisting) && m_sharedMemory.getSize() < size) {
		result = m_sharedMemory.setSize(size);
		if (!result) {
			if (!(flags & FileFlag_OpenExisting))
				psx::SharedMemory::unlink(name);

			return NULL;
		}
	}

	p = m_mapping.map(NULL, size, protection, MAP_SHARED, m_sharedMemory, 0);
	if (!p) {
		if (!(flags & FileFlag_OpenExisting))
			psx::SharedMemory::unlink(name);

		return NULL;
	}

	if (!(flags & FileFlag_OpenExisting))
		m_sharedMemoryName = name;

#endif

	m_p = p;
	m_size = size;
	return m_p;
}